

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O2

bool __thiscall
rlottie::internal::renderer::GradientStroke::updateContent
          (GradientStroke *this,int frameNo,VMatrix *matrix,float alpha)

{
  Drawable *this_00;
  float fVar1;
  CapStyle cap;
  JoinStyle join;
  VGradient *pVVar2;
  GradientStroke *pGVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  long *plVar9;
  vector<float,_std::allocator<float>_> *pvVar10;
  undefined8 *puVar11;
  float *elm;
  float *pfVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  VBrush local_38;
  
  fVar13 = model::Gradient::opacity(&this->mData->super_Gradient,frameNo);
  model::Gradient::update(&this->mData->super_Gradient,&this->mGradient,frameNo);
  pVVar2 = (this->mGradient)._M_t.super___uniq_ptr_impl<VGradient,_std::default_delete<VGradient>_>.
           _M_t.super__Tuple_impl<0UL,_VGradient_*,_std::default_delete<VGradient>_>.
           super__Head_base<0UL,_VGradient_*,_false>._M_head_impl;
  pVVar2->mAlpha = fVar13 * alpha;
  fVar1 = matrix->m12;
  fVar14 = matrix->m13;
  fVar15 = matrix->m21;
  fVar5 = matrix->m22;
  fVar6 = matrix->m23;
  fVar7 = matrix->mtx;
  fVar8 = matrix->mty;
  (pVVar2->mMatrix).m11 = matrix->m11;
  (pVVar2->mMatrix).m12 = fVar1;
  (pVVar2->mMatrix).m13 = fVar14;
  (pVVar2->mMatrix).m21 = fVar15;
  (pVVar2->mMatrix).m22 = fVar5;
  (pVVar2->mMatrix).m23 = fVar6;
  (pVVar2->mMatrix).mtx = fVar7;
  (pVVar2->mMatrix).mty = fVar8;
  *(undefined8 *)((long)&(pVVar2->mMatrix).mty + 2) = *(undefined8 *)((long)&matrix->mty + 2);
  fVar14 = VMatrix::scale(&((this->mGradient)._M_t.
                            super___uniq_ptr_impl<VGradient,_std::default_delete<VGradient>_>._M_t.
                            super__Tuple_impl<0UL,_VGradient_*,_std::default_delete<VGradient>_>.
                            super__Head_base<0UL,_VGradient_*,_false>._M_head_impl)->mMatrix);
  this_00 = &(this->super_Paint).mDrawable;
  VBrush::VBrush(&local_38,
                 (this->mGradient)._M_t.
                 super___uniq_ptr_impl<VGradient,_std::default_delete<VGradient>_>._M_t.
                 super__Tuple_impl<0UL,_VGradient_*,_std::default_delete<VGradient>_>.
                 super__Head_base<0UL,_VGradient_*,_false>._M_head_impl);
  (this->super_Paint).mDrawable.super_VDrawable.mBrush.mType = local_38.mType;
  *(undefined4 *)&(this->super_Paint).mDrawable.super_VDrawable.mBrush.field_0x4 = local_38._4_4_;
  (this->super_Paint).mDrawable.super_VDrawable.mBrush.field_1 = local_38.field_1;
  pGVar3 = this->mData;
  cap = pGVar3->mCapStyle;
  join = pGVar3->mJoinStyle;
  fVar1 = pGVar3->mMiterLimit;
  fVar15 = model::Property<float,_void>::value(&pGVar3->mWidth,frameNo);
  VDrawable::setStrokeInfo(&this_00->super_VDrawable,cap,join,fVar1,fVar15 * fVar14);
  if ((this->mData->mDash).mData.
      super__Vector_base<rlottie::internal::model::Property<float,_void>,_std::allocator<rlottie::internal::model::Property<float,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->mData->mDash).mData.
      super__Vector_base<rlottie::internal::model::Property<float,_void>,_std::allocator<rlottie::internal::model::Property<float,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    plVar9 = (long *)_ZTWL11Dash_Vector();
    if (plVar9[1] != *plVar9) {
      plVar9[1] = *plVar9;
    }
    pGVar3 = this->mData;
    pvVar10 = (vector<float,_std::allocator<float>_> *)_ZTWL11Dash_Vector();
    model::Dash::getDashInfo(&pGVar3->mDash,frameNo,pvVar10);
    plVar9 = (long *)_ZTWL11Dash_Vector();
    if (*plVar9 != plVar9[1]) {
      puVar11 = (undefined8 *)_ZTWL11Dash_Vector();
      pfVar4 = (float *)puVar11[1];
      for (pfVar12 = (float *)*puVar11; pfVar12 != pfVar4; pfVar12 = pfVar12 + 1) {
        *pfVar12 = *pfVar12 * fVar14;
      }
      pvVar10 = (vector<float,_std::allocator<float>_> *)_ZTWL11Dash_Vector();
      VDrawable::setDashInfo(&this_00->super_VDrawable,pvVar10);
    }
  }
  return 1e-06 < ABS(fVar13 * alpha);
}

Assistant:

bool renderer::GradientStroke::updateContent(int frameNo, const VMatrix &matrix,
                                             float alpha)
{
    float combinedAlpha = alpha * mData->opacity(frameNo);

    mData->update(mGradient, frameNo);
    mGradient->setAlpha(combinedAlpha);
    mGradient->mMatrix = matrix;
    auto scale = mGradient->mMatrix.scale();
    mDrawable.setBrush(VBrush(mGradient.get()));
    mDrawable.setStrokeInfo(mData->capStyle(), mData->joinStyle(),
                            mData->miterLimit(), mData->width(frameNo) * scale);

    if (mData->hasDashInfo()) {
        Dash_Vector.clear();
        mData->getDashInfo(frameNo, Dash_Vector);
        if (!Dash_Vector.empty()) {
            for (auto &elm : Dash_Vector) elm *= scale;
            mDrawable.setDashInfo(Dash_Vector);
        }
    }

    return !vIsZero(combinedAlpha);
}